

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass.cpp
# Opt level: O2

int main(void)

{
  HSQUIRRELVM vm_00;
  Foo foo;
  Klass<Foo,_void> k;
  Klass<Foo2,_Foo> k_1;
  VMStd vm;
  allocator local_ed;
  Foo local_ec;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  Klass<Foo,_void> local_c0;
  string local_a8;
  __shared_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2> local_88;
  HSQOBJECT local_78;
  VM local_68;
  
  squall::VMStd::VMStd((VMStd *)&local_68,0x400);
  squall::VMStd::dofile((VMStd *)&local_68,"klass.nut");
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"Foo",(allocator *)&local_a8);
  squall::Klass<Foo,_void>::Klass(&local_c0,&local_68,(string *)&local_e8);
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  squall::Klass<Foo,void>::func<void(Foo::*)()>((Klass<Foo,void> *)&local_c0,"bar",0x106b1c);
  squall::Klass<Foo,void>::func<int(Foo::*)(std::__cxx11::string_const&)>
            ((Klass<Foo,void> *)&local_c0,"baz",0x106bae);
  local_ec.n_ = 0;
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"zot",(allocator *)&local_a8);
  squall::TableBase::call<void,Foo*>
            ((TableBase *)
             local_68.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,(string *)&local_e8,
             &local_ec);
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  std::__cxx11::string::string((string *)&local_a8,"qux",&local_ed);
  vm_00 = *(HSQUIRRELVM *)CONCAT44(local_c0.vm_._4_4_,local_c0.vm_._0_4_);
  std::__shared_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88);
  local_78._type = (*((local_88._M_ptr)->super_KlassImpBase)._vptr_KlassImpBase[3])();
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/klass.cpp:40:27)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/klass.cpp:40:27)>
             ::_M_manager;
  squall::detail::defun_local<void,Foo*,std::__cxx11::string_const&>
            (vm_00,&local_78,&local_a8,
             (function<void_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"quux",(allocator *)&local_a8);
  squall::TableBase::call<void,Foo*>
            ((TableBase *)
             local_68.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,(string *)&local_e8,
             &local_ec);
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  squall::Klass<Foo,_void>::~Klass(&local_c0);
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"Foo2",(allocator *)&local_c0);
  squall::Klass<Foo2,_Foo>::Klass((Klass<Foo2,_Foo> *)&local_a8,&local_68,(string *)&local_e8);
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>((Klass<Foo2,Foo> *)&local_a8,"bar2",0x106cf2);
  local_c0.vm_._0_4_ = 0;
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"zot2",(allocator *)&local_78);
  squall::TableBase::call<void,Foo2*>
            ((TableBase *)
             local_68.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,(string *)&local_e8,
             (Foo2 *)&local_c0);
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  squall::Klass<Foo2,_Foo>::~Klass((Klass<Foo2,_Foo> *)&local_a8);
  squall::VM::~VM(&local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("klass.nut");

        {
            squall::Klass<Foo> k(vm, "Foo");
            k.func("bar", &Foo::bar);
            k.func("baz", &Foo::baz);

            Foo foo;
            vm.call<void>("zot", &foo);

            k.func("qux", [](Foo* x, const std::string& y) {
                    std::cerr << "**** qux called: " << y << std::endl;
                    x->baz(y);
                });
            vm.call<void>("quux", &foo);
        }

        {
            squall::Klass<Foo2, Foo> k(vm, "Foo2");
            k.func("bar2", &Foo2::bar2);

            Foo2 foo2;
            vm.call<void>("zot2", &foo2);
        }
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}